

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O3

quaternion * quaternion_normalize(quaternion *self)

{
  anon_struct_16_4_d86d922e_for_anon_union_16_3_07544b10_for_quaternion_0_1 aVar1;
  undefined1 auVar2 [16];
  anon_union_16_3_07544b10_for_quaternion_0 aVar3;
  float fVar4;
  
  aVar1 = (self->field_0).field_1;
  fVar4 = SQRT(aVar1.w * aVar1.w + aVar1.z * aVar1.z + aVar1.x * aVar1.x + aVar1.y * aVar1.y);
  if (1e-05 <= fVar4) {
    auVar2._4_4_ = fVar4;
    auVar2._0_4_ = fVar4;
    auVar2._8_4_ = fVar4;
    auVar2._12_4_ = fVar4;
    aVar3.field_1 =
         (anon_struct_16_4_d86d922e_for_anon_union_16_3_07544b10_for_quaternion_0_1)
         divps(aVar1,auVar2);
    self->field_0 = aVar3;
  }
  return self;
}

Assistant:

HYPAPI struct quaternion *quaternion_normalize(struct quaternion *self)
{
	HYP_FLOAT mag;

	mag = quaternion_magnitude(self);

	if (scalar_equalsf(mag, 0.0f)) {
		/* can't normalize a zero
		 * avoid divide by zero
		 */
		return self;
	}

	self->x /= mag;
	self->y /= mag;
	self->z /= mag;
	self->w /= mag;

	return self;
}